

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void process_text(CHAR_DATA *ch,char *text)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  char *in_RSI;
  long in_RDI;
  uint iloc;
  uint i;
  uint rcount;
  uint len;
  bool found;
  char rbuf [4608];
  char tbuf [4608];
  char obuf [9216];
  char *in_stack_ffffffffffffb7c0;
  CHAR_DATA *in_stack_ffffffffffffb7c8;
  undefined4 in_stack_ffffffffffffb7d0;
  uint in_stack_ffffffffffffb7d4;
  uint local_4828;
  uint local_4824;
  uint local_4820;
  char *in_stack_ffffffffffffb7e8;
  char local_3618 [4608];
  char local_2418 [9224];
  char *local_10;
  long local_8;
  
  bVar2 = false;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = str_cmp(in_RSI,"");
  if (bVar1) {
    bVar1 = str_cmp(local_10,"exit");
    if (bVar1) {
      bVar1 = str_cmp(local_10,"finish");
      if (bVar1) {
        bVar1 = str_cmp(local_10,"backline");
        if (bVar1) {
          bVar2 = str_cmp(local_10,"show");
          if (bVar2) {
            if (*local_10 == '\0') {
              if (*local_10 == '\0') {
                send_to_char((char *)CONCAT44(in_stack_ffffffffffffb7d4,in_stack_ffffffffffffb7d0),
                             in_stack_ffffffffffffb7c8);
                return;
              }
            }
            else {
              local_2418[0] = '\0';
              sVar3 = strlen(local_10);
              if (0x50 < sVar3) {
                sprintf(local_3618,"%s",local_10);
                local_4828 = 1;
                while( true ) {
                  in_stack_ffffffffffffb7c8 = (CHAR_DATA *)(ulong)local_4828;
                  sVar3 = strlen(local_10);
                  if ((CHAR_DATA *)(sVar3 / 0x50) < in_stack_ffffffffffffb7c8) break;
                  for (local_4824 = local_4828 * 0x50;
                      (local_4828 * 0x50 - 0xf < local_4824 && (local_3618[local_4824] != ' '));
                      local_4824 = local_4824 - 1) {
                  }
                  in_stack_ffffffffffffb7d4 = local_4824;
                  if (local_4824 <= local_4828 * 0x50 - 0xf) {
                    in_stack_ffffffffffffb7d4 = local_4828 * 0x50;
                    local_4824 = in_stack_ffffffffffffb7d4;
                  }
                  while (local_3618[in_stack_ffffffffffffb7d4 + 1] != '\0') {
                    (&stack0xffffffffffffb7e8)[in_stack_ffffffffffffb7d4 - local_4824] =
                         local_3618[in_stack_ffffffffffffb7d4 + 1];
                    in_stack_ffffffffffffb7d4 = in_stack_ffffffffffffb7d4 + 1;
                  }
                  (&stack0xffffffffffffb7e8)[in_stack_ffffffffffffb7d4 - local_4824] = 0;
                  local_3618[local_4824] = '\n';
                  local_3618[local_4824 + 1] = '\r';
                  local_3618[local_4824 + 2] = '\0';
                  strcat(local_3618,&stack0xffffffffffffb7e8);
                  local_4828 = local_4828 + 1;
                }
                send_to_char((char *)CONCAT44(in_stack_ffffffffffffb7d4,in_stack_ffffffffffffb7d0),
                             in_stack_ffffffffffffb7c8);
              }
              if (*(long *)(*(long *)(local_8 + 0xc0) + 3000) != 0) {
                strcat(local_2418,*(char **)(*(long *)(local_8 + 0xc0) + 3000));
              }
              sVar3 = strlen(local_10);
              if (sVar3 < 0x50) {
                local_4828 = 0;
                while( true ) {
                  in_stack_ffffffffffffb7c0 = (char *)(ulong)local_4828;
                  pcVar4 = (char *)strlen(local_10);
                  if (pcVar4 < in_stack_ffffffffffffb7c0) break;
                  if (local_10[local_4828] == '~') {
                    send_to_char((char *)CONCAT44(in_stack_ffffffffffffb7d4,
                                                  in_stack_ffffffffffffb7d0),
                                 in_stack_ffffffffffffb7c8);
                    return;
                  }
                  local_4828 = local_4828 + 1;
                }
                strcat(local_2418,local_10);
              }
              else {
                strcat(local_2418,local_3618);
                for (local_4828 = 0; sVar3 = strlen(local_3618), local_4828 <= sVar3;
                    local_4828 = local_4828 + 1) {
                  if (local_3618[local_4828] == '~') {
                    send_to_char((char *)CONCAT44(in_stack_ffffffffffffb7d4,
                                                  in_stack_ffffffffffffb7d0),
                                 in_stack_ffffffffffffb7c8);
                    return;
                  }
                }
              }
              strcat(local_2418,"\n\r");
              sVar3 = strlen(local_2418);
              if (0x23ff < sVar3) {
                send_to_char((char *)CONCAT44(in_stack_ffffffffffffb7d4,in_stack_ffffffffffffb7d0),
                             in_stack_ffffffffffffb7c8);
                return;
              }
              free_pstring(in_stack_ffffffffffffb7c0);
              pcVar4 = palloc_string(in_stack_ffffffffffffb7e8);
              *(char **)(*(long *)(local_8 + 0xc0) + 3000) = pcVar4;
            }
            send_to_char((char *)CONCAT44(in_stack_ffffffffffffb7d4,in_stack_ffffffffffffb7d0),
                         in_stack_ffffffffffffb7c8);
          }
          else {
            send_to_char((char *)CONCAT44(in_stack_ffffffffffffb7d4,in_stack_ffffffffffffb7d0),
                         in_stack_ffffffffffffb7c8);
          }
        }
        else if ((*(long *)(*(long *)(local_8 + 0xc0) + 3000) == 0) ||
                (**(char **)(*(long *)(local_8 + 0xc0) + 3000) == '\0')) {
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffb7d4,in_stack_ffffffffffffb7d0),
                       in_stack_ffffffffffffb7c8);
        }
        else {
          strcpy(local_2418,*(char **)(*(long *)(local_8 + 0xc0) + 3000));
          sVar3 = strlen(local_2418);
          for (local_4820 = (uint)sVar3; local_4820 != 0; local_4820 = local_4820 - 1) {
            if (local_2418[local_4820] == '\r') {
              if (bVar2) {
                local_2418[local_4820 + 1] = '\0';
                free_pstring(in_stack_ffffffffffffb7c0);
                pcVar4 = palloc_string(in_stack_ffffffffffffb7e8);
                *(char **)(*(long *)(local_8 + 0xc0) + 3000) = pcVar4;
                send_to_char((char *)CONCAT44(in_stack_ffffffffffffb7d4,in_stack_ffffffffffffb7d0),
                             in_stack_ffffffffffffb7c8);
                return;
              }
              if (local_4820 != 0) {
                local_4820 = local_4820 - 1;
              }
              bVar2 = true;
            }
          }
          local_2418[0] = '\0';
          free_pstring(in_stack_ffffffffffffb7c0);
          pcVar4 = palloc_string(in_stack_ffffffffffffb7e8);
          *(char **)(*(long *)(local_8 + 0xc0) + 3000) = pcVar4;
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffb7d4,in_stack_ffffffffffffb7d0),
                       in_stack_ffffffffffffb7c8);
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffb7d4,in_stack_ffffffffffffb7d0),
                       in_stack_ffffffffffffb7c8);
        }
      }
      else {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffb7d4,in_stack_ffffffffffffb7d0),
                     in_stack_ffffffffffffb7c8);
        if (*(long *)(*(long *)(local_8 + 0xc0) + 0xbc0) != 0) {
          (**(code **)(*(long *)(local_8 + 0xc0) + 0xbc0))
                    (local_8,*(undefined8 *)(*(long *)(local_8 + 0xc0) + 3000));
        }
        *(undefined1 *)(*(long *)(local_8 + 0xc0) + 0xbb0) = 0;
        *(undefined8 *)(*(long *)(local_8 + 0xc0) + 0xbc0) = 0;
      }
    }
    else {
      *(undefined1 *)(*(long *)(local_8 + 0xc0) + 0xbb0) = 0;
      **(undefined1 **)(*(long *)(local_8 + 0xc0) + 3000) = 0;
      *(undefined8 *)(*(long *)(local_8 + 0xc0) + 0xbc0) = 0;
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffb7d4,in_stack_ffffffffffffb7d0),
                   in_stack_ffffffffffffb7c8);
    }
  }
  return;
}

Assistant:

void process_text(CHAR_DATA *ch, char *text)
{
	char obuf[MSL * 2], tbuf[MSL], rbuf[MSL];
	bool found= false;
	unsigned int len, rcount, i, iloc;

	if (!str_cmp(text, ""))
		return;

	if (!str_cmp(text, "exit"))
	{
		ch->pcdata->entering_text= false;
		ch->pcdata->entered_text[0] = '\0';
		ch->pcdata->end_fun = nullptr;

		send_to_char("Exiting without saving changes.\n\r", ch);
		return;
	}

	if (!str_cmp(text, "finish"))
	{
		send_to_char("Saving changes and exiting...\n\r", ch);

		if (ch->pcdata->end_fun)
			(*ch->pcdata->end_fun)(ch, ch->pcdata->entered_text);

		ch->pcdata->entering_text= false;
		ch->pcdata->end_fun = nullptr;
		return;
	}

	if (!str_cmp(text, "backline"))
	{
		if (ch->pcdata->entered_text == nullptr || ch->pcdata->entered_text[0] == '\0')
		{
			send_to_char("No lines left to remove.", ch);
			return;
		}

		strcpy(obuf, ch->pcdata->entered_text);

		for (len = strlen(obuf); len > 0; len--)
		{
			if (obuf[len] == '\r')
			{
				if (!found)
				{
					if (len > 0)
						len--;

					found = true;
				}
				else
				{
					obuf[len + 1] = '\0';

					free_pstring(ch->pcdata->entered_text);
					ch->pcdata->entered_text = palloc_string(obuf);

					send_to_char("Line deleted.", ch);
					return;
				}
			}
		}

		obuf[0] = '\0';

		free_pstring(ch->pcdata->entered_text);
		ch->pcdata->entered_text = palloc_string(obuf);

		send_to_char("Line deleted.", ch);
		send_to_char(ch->pcdata->entered_text, ch);
		return;
	}

	if (!str_cmp(text, "show"))
	{
		send_to_char(ch->pcdata->entered_text, ch);
		return;
	}

	if (text[0] != '\0')
	{
		obuf[0] = '\0';

		if (strlen(text) > 80)
		{
			sprintf(tbuf, "%s", text);

			for (i = 1; i <= strlen(text) / 80; i++)
			{
				for (rcount = 80 * i; rcount > (80 * i) - 15; rcount--)
				{
					if (tbuf[rcount] == ' ')
						break;
				}

				if (rcount <= (80 * i) - 15)
					rcount = 80 * i;

				for (iloc = rcount; tbuf[iloc + 1]; iloc++)
				{
					rbuf[iloc - rcount] = tbuf[iloc + 1];
				}

				rbuf[iloc - rcount] = '\0';
				tbuf[rcount] = '\n';
				tbuf[rcount + 1] = '\r';
				tbuf[rcount + 2] = '\0';
				strcat(tbuf, rbuf);
			}

			send_to_char("Over 80 characters, wrapping line.\n\r", ch);
		}

		if (ch->pcdata->entered_text)
			strcat(obuf, ch->pcdata->entered_text);

		if (strlen(text) < 80)
		{
			for (i = 0; i <= strlen(text); i++)
			{
				if (text[i] == '~')
				{
					send_to_char("Tilde found, line will not be added.\n\r", ch);
					return;
				}
			}

			strcat(obuf, text);
		}
		else
		{
			strcat(obuf, tbuf);

			for (i = 0; i <= strlen(tbuf); i++)
			{
				if (tbuf[i] == '~')
				{
					send_to_char("Tilde found, line will not be added.\n\r", ch);
					return;
				}
			}
		}

		strcat(obuf, "\n\r");

		if (strlen(obuf) >= MSL * 2)
		{
			send_to_char("String exceeds buffer.\n\r", ch);
			return;
		}

		free_pstring(ch->pcdata->entered_text);
		ch->pcdata->entered_text = palloc_string(obuf);
	}
	else if (text[0] == '\0')
	{
		send_to_char("Add what?", ch);
		return;
	}

	send_to_char("Line added.", ch);
	return;
}